

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,Path *suffix)

{
  size_t sVar1;
  size_t sVar2;
  String *pSVar3;
  Array<kj::String> local_a8;
  String *local_90;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  Array<kj::String> *__range1_1;
  String *p;
  String *__end1;
  Array<kj::String> *local_50;
  String *__begin1;
  Array<kj::String> *__range1;
  ArrayBuilder<kj::String> newParts;
  Path *suffix_local;
  Path *this_local;
  
  newParts.disposer = (ArrayDisposer *)suffix;
  sVar1 = Array<kj::String>::size(&this->parts);
  sVar2 = Array<kj::String>::size((Array<kj::String> *)newParts.disposer);
  heapArrayBuilder<kj::String>((ArrayBuilder<kj::String> *)&__range1,sVar1 + sVar2);
  __begin1 = (String *)this;
  local_50 = (Array<kj::String> *)Array<kj::String>::begin(&this->parts);
  p = Array<kj::String>::end((Array<kj::String> *)__begin1);
  for (; local_50 != (Array<kj::String> *)p; local_50 = local_50 + 1) {
    __range1_1 = local_50;
    pSVar3 = mv<kj::String>((String *)local_50);
    ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)&__range1,pSVar3);
  }
  __begin1_1 = (String *)newParts.disposer;
  __end1_1 = Array<kj::String>::begin((Array<kj::String> *)newParts.disposer);
  p_1 = Array<kj::String>::end((Array<kj::String> *)__begin1_1);
  for (; __end1_1 != p_1; __end1_1 = __end1_1 + 1) {
    local_90 = __end1_1;
    pSVar3 = mv<kj::String>(__end1_1);
    ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)&__range1,pSVar3);
  }
  ArrayBuilder<kj::String>::finish(&local_a8,(ArrayBuilder<kj::String> *)&__range1);
  Path(__return_storage_ptr__,&local_a8,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_a8);
  ArrayBuilder<kj::String>::~ArrayBuilder((ArrayBuilder<kj::String> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(Path&& suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}